

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::PropertyCaseItemSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind == DefaultPropertyCaseItem) || (kind == StandardPropertyCaseItem)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PropertyCaseItemSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultPropertyCaseItem:
        case SyntaxKind::StandardPropertyCaseItem:
            return true;
        default:
            return false;
    }
}